

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void * ndiHexDecode(void *data,char *cp,int n)

{
  char cVar1;
  uchar *bdata;
  ulong uVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  
  if (0 < n) {
    uVar2 = 0;
    do {
      cVar1 = cp[uVar2 * 2];
      if ((byte)(cVar1 + 0x9fU) < 6) {
        cVar3 = cVar1 + -0x57;
      }
      else if ((byte)(cVar1 + 0xbfU) < 6) {
        cVar3 = cVar1 + -0x37;
      }
      else {
        cVar3 = cVar1 + -0x30;
        if (9 < (byte)(cVar1 - 0x30U)) {
          cVar3 = '\0';
        }
      }
      cVar1 = cp[uVar2 * 2 + 1];
      bVar5 = cVar3 * '\x10';
      if ((byte)(cVar1 + 0x9fU) < 6) {
        bVar4 = cVar1 + 0xa9;
LAB_00106830:
        bVar5 = bVar4 | bVar5;
      }
      else {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar4 = cVar1 - 0x37;
          goto LAB_00106830;
        }
        if ((byte)(cVar1 - 0x30U) < 10) {
          bVar5 = (bVar5 + cVar1) - 0x30;
        }
      }
      *(byte *)((long)data + uVar2) = bVar5;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return data;
}

Assistant:

ndicapiExport void* ndiHexDecode(void* data, const char* cp, int n)
{
  unsigned char* bdata;
  int i, c1, c2;
  unsigned int d;

  bdata = (unsigned char*)data;

  for (i = 0; i < n; i++)
  {
    d = 0;
    c1 = *cp++;
    if (c1 >= 'a' && c1 <= 'f')
    {
      d = (c1 + (10 - 'a'));
    }
    else if (c1 >= 'A' && c1 <= 'F')
    {
      d = (c1 + (10 - 'A'));
    }
    else if (c1 >= '0' && c1 <= '9')
    {
      d = (c1 - '0');
    }
    c2 = *cp++;
    d <<= 4;
    if (c2 >= 'a' && c2 <= 'f')
    {
      d |= (c2 + (10 - 'a'));
    }
    else if (c2 >= 'A' && c2 <= 'F')
    {
      d |= (c2 + (10 - 'A'));
    }
    else if (c2 >= '0' && c2 <= '9')
    {
      d |= (c2 - '0');
    }

    bdata[i] = d;
  }

  return data;
}